

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void AddFontStyles(TidyDocImpl *doc,Node *node,AttVal *av)

{
  AttVal *local_20;
  AttVal *av_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  for (local_20 = av; local_20 != (AttVal *)0x0; local_20 = local_20->next) {
    if ((local_20 != (AttVal *)0x0) && (local_20->value != (tmbstr)0x0)) {
      if ((local_20 == (AttVal *)0x0) ||
         ((local_20->dict == (Attribute *)0x0 || (local_20->dict->id != TidyAttr_FACE)))) {
        if ((local_20 == (AttVal *)0x0) ||
           ((local_20->dict == (Attribute *)0x0 || (local_20->dict->id != TidyAttr_SIZE)))) {
          if ((local_20 != (AttVal *)0x0) &&
             ((local_20->dict != (Attribute *)0x0 && (local_20->dict->id == TidyAttr_COLOR)))) {
            AddFontColor(doc,node,local_20->value);
          }
        }
        else {
          AddFontSize(doc,node,local_20->value);
        }
      }
      else {
        AddFontFace(doc,node,local_20->value);
      }
    }
  }
  return;
}

Assistant:

static void AddFontStyles( TidyDocImpl* doc, Node *node, AttVal *av)
{
    while (av)
    {
        if (AttrHasValue(av))
        {
            if (attrIsFACE(av))
                AddFontFace( doc, node, av->value );
            else if (attrIsSIZE(av))
                AddFontSize( doc, node, av->value );
            else if (attrIsCOLOR(av))
                AddFontColor( doc, node, av->value );
        }
        av = av->next;
    }
}